

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O3

void t51(void)

{
  undefined8 uVar1;
  ALLEGRO_USTR_INFO info;
  char str [256];
  undefined1 auStack_128 [16];
  undefined4 local_118;
  
  uVar1 = al_ref_buffer(auStack_128,"Allegro",3);
  al_ustr_to_buffer(uVar1,&local_118,10);
  if (local_118 == 0x6c6c41) {
    log_printf("OK   %s\n","0 == memcmp(str, \"All\", 4)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(str, \"All\", 4)");
    error = error + 1;
  }
  al_ustr_to_buffer(uVar1,&local_118,4);
  if (local_118 == 0x6c6c41) {
    log_printf("OK   %s\n","0 == memcmp(str, \"All\", 4)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(str, \"All\", 4)");
    error = error + 1;
  }
  al_ustr_to_buffer(uVar1,&local_118,3);
  if (local_118._2_1_ == '\0' && (short)local_118 == 0x6c41) {
    log_printf("OK   %s\n","0 == memcmp(str, \"Al\", 3)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(str, \"Al\", 3)");
    error = error + 1;
  }
  return;
}

Assistant:

static void t51(void)
{
   char str[256];
   const ALLEGRO_USTR *us;
   ALLEGRO_USTR_INFO info;

   us = al_ref_buffer(&info, "Allegro", 3);
   al_ustr_to_buffer(us, str, 10);
   CHECK(0 == memcmp(str, "All", 4));
   al_ustr_to_buffer(us, str, 4);
   CHECK(0 == memcmp(str, "All", 4));
   al_ustr_to_buffer(us, str, 3);
   CHECK(0 == memcmp(str, "Al", 3));
}